

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadpool.c
# Opt level: O1

int uv_cancel(uv_req_t *req)

{
  int iVar1;
  uv_loop_t *local_28;
  uv_loop_t *loop;
  uv__work *wreq;
  uv_req_t *req_local;
  
  switch(req->type) {
  case UV_FS:
    local_28 = *(uv_loop_t **)&req[1].type;
    loop = (uv_loop_t *)req[5].reserved;
    break;
  case UV_WORK:
    local_28 = (uv_loop_t *)req[1].data;
    loop = (uv_loop_t *)(req[1].reserved + 1);
    break;
  case UV_GETADDRINFO:
    local_28 = (uv_loop_t *)req[1].data;
    loop = (uv_loop_t *)&req[1].type;
    break;
  case UV_GETNAMEINFO:
    local_28 = (uv_loop_t *)req[1].data;
    loop = (uv_loop_t *)&req[1].type;
    break;
  case UV_RANDOM:
    local_28 = (uv_loop_t *)req[1].data;
    loop = (uv_loop_t *)(req[1].reserved + 3);
    break;
  default:
    return -0x16;
  }
  iVar1 = uv__work_cancel(local_28,req,(uv__work *)loop);
  return iVar1;
}

Assistant:

int uv_cancel(uv_req_t* req) {
  struct uv__work* wreq;
  uv_loop_t* loop;

  switch (req->type) {
  case UV_FS:
    loop =  ((uv_fs_t*) req)->loop;
    wreq = &((uv_fs_t*) req)->work_req;
    break;
  case UV_GETADDRINFO:
    loop =  ((uv_getaddrinfo_t*) req)->loop;
    wreq = &((uv_getaddrinfo_t*) req)->work_req;
    break;
  case UV_GETNAMEINFO:
    loop = ((uv_getnameinfo_t*) req)->loop;
    wreq = &((uv_getnameinfo_t*) req)->work_req;
    break;
  case UV_RANDOM:
    loop = ((uv_random_t*) req)->loop;
    wreq = &((uv_random_t*) req)->work_req;
    break;
  case UV_WORK:
    loop =  ((uv_work_t*) req)->loop;
    wreq = &((uv_work_t*) req)->work_req;
    break;
  default:
    return UV_EINVAL;
  }

  return uv__work_cancel(loop, req, wreq);
}